

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::FBXConverter::TrySetTextureProperties
          (FBXConverter *this,aiMaterial *out_mat,TextureMap *textures,string *propName,
          aiTextureType target,MeshGeometry *mesh)

{
  Texture *tex;
  pointer ppaVar1;
  uint uVar2;
  bool bVar3;
  __type _Var4;
  const_iterator cVar5;
  PropertyTable *this_00;
  __normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_> _Var6;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pvVar7;
  MeshGeometry *this_01;
  MatIndexArray *pMVar8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var9;
  _Base_ptr p_Var10;
  uint i;
  uint uVar11;
  undefined1 useTemplate;
  bool ok;
  int uvIndex;
  uint local_640;
  aiTextureType local_63c;
  aiMaterial *out_mat_local;
  uint matIndex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  _Rb_tree_node_base *local_5c8;
  format local_5c0;
  aiUVTransform local_448;
  aiString path;
  
  out_mat_local = out_mat;
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>_>_>
          ::find(&textures->_M_t,propName);
  if (((_Rb_tree_header *)cVar5._M_node != &(textures->_M_t)._M_impl.super__Rb_tree_header) &&
     (tex = *(Texture **)(cVar5._M_node + 2), tex != (Texture *)0x0)) {
    GetTexturePath(&path,this,tex);
    aiMaterial::AddProperty(out_mat_local,&path,"$tex.file",target,0);
    local_448.mRotation = 0.0;
    local_448.mTranslation = tex->uvTrans;
    local_448.mScaling = tex->uvScaling;
    useTemplate = 0;
    aiMaterial::AddProperty(out_mat_local,&local_448,1,"$tex.uvtrafo",target,0);
    this_00 = Texture::Props(tex);
    uvIndex = 0;
    std::__cxx11::string::string((string *)&local_5c0,"UVSet",(allocator *)&local_628);
    PropertyGet<std::__cxx11::string>
              (&local_5e8,(FBX *)this_00,(PropertyTable *)&local_5c0,(string *)&ok,(bool *)0x0,
               (bool)useTemplate);
    std::__cxx11::string::~string((string *)&local_5c0);
    if ((ok == true) &&
       ((bVar3 = std::operator!=(&local_5e8,"default"), bVar3 && (local_5e8._M_string_length != 0)))
       ) {
      ppaVar1 = (this->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<aiMaterial**,std::vector<aiMaterial*,std::allocator<aiMaterial*>>>,__gnu_cxx::__ops::_Iter_equals_val<aiMaterial*const>>
                        (ppaVar1,(this->materials).
                                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,&out_mat_local);
      matIndex = (uint)((ulong)((long)_Var6._M_current - (long)ppaVar1) >> 3);
      uvIndex = -1;
      local_63c = target;
      if (mesh == (MeshGeometry *)0x0) {
        local_5c8 = &(this->meshes_converted)._M_t._M_impl.super__Rb_tree_header._M_header;
        local_640 = 0xffffffff;
        for (p_Var10 = (this->meshes_converted)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
            ; uVar11 = local_640, target = local_63c, uVar2 = uvIndex, p_Var10 != local_5c8;
            p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
          uVar11 = uvIndex;
          uVar2 = local_640;
          if ((*(long *)(p_Var10 + 1) != 0) &&
             (this_01 = (MeshGeometry *)
                        __dynamic_cast(*(long *)(p_Var10 + 1),&Geometry::typeinfo,
                                       &MeshGeometry::typeinfo,0), uVar11 = uvIndex,
             uVar2 = local_640, this_01 != (MeshGeometry *)0x0)) {
            pMVar8 = MeshGeometry::GetMaterialIndices(this_01);
            _Var9 = std::
                    __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                              ((pMVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start,
                               (pMVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish,&matIndex);
            uVar11 = uvIndex;
            uVar2 = local_640;
            if (_Var9._M_current !=
                (pMVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
              uVar11 = 0;
              while ((uVar11 != 8 &&
                     (pvVar7 = MeshGeometry::GetTextureCoords(this_01,uVar11),
                     (pvVar7->
                     super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_start !=
                     (pvVar7->
                     super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_finish))) {
                MeshGeometry::GetTextureCoordChannelName_abi_cxx11_
                          ((string *)&local_5c0,this_01,uVar11);
                _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&local_5c0,&local_5e8);
                std::__cxx11::string::~string((string *)&local_5c0);
                if (_Var4) {
                  uVar2 = uVar11;
                  if (local_640 == 0xffffffff) goto LAB_004f440e;
                  std::operator+(&local_608,"the UV channel named ",&local_5e8);
                  std::operator+(&local_628,&local_608,
                                 " appears at different positions in meshes, results will be wrong")
                  ;
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  basic_formatter<std::__cxx11::string>
                            ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                             &local_5c0,&local_628);
                  LogFunctions<Assimp::FBXImporter>::LogWarn(&local_5c0);
                  goto LAB_004f43f1;
                }
                uVar11 = uVar11 + 1;
              }
              std::operator+(&local_608,"did not find UV channel named ",&local_5e8);
              std::operator+(&local_628,&local_608," in a mesh using this material");
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              basic_formatter<std::__cxx11::string>
                        ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         &local_5c0,&local_628);
              LogFunctions<Assimp::FBXImporter>::LogWarn(&local_5c0);
LAB_004f43f1:
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_5c0);
              std::__cxx11::string::~string((string *)&local_628);
              std::__cxx11::string::~string((string *)&local_608);
              uVar11 = uvIndex;
              uVar2 = local_640;
            }
          }
LAB_004f440e:
          local_640 = uVar2;
          uvIndex = uVar11;
        }
      }
      else {
        uVar11 = 0;
        while ((target = local_63c, uVar11 != 8 &&
               (pvVar7 = MeshGeometry::GetTextureCoords(mesh,uVar11),
               (pvVar7->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
               _M_impl.super__Vector_impl_data._M_start !=
               (pvVar7->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
               _M_impl.super__Vector_impl_data._M_finish))) {
          MeshGeometry::GetTextureCoordChannelName_abi_cxx11_((string *)&local_5c0,mesh,uVar11);
          _Var4 = std::operator==((string *)&local_5c0,&local_5e8);
          std::__cxx11::string::~string((string *)&local_5c0);
          target = local_63c;
          uVar2 = uVar11;
          if (_Var4) goto LAB_004f443f;
          uVar11 = uVar11 + 1;
        }
        std::operator+(&local_608,"did not find UV channel named ",&local_5e8);
        std::operator+(&local_628,&local_608," in a mesh using this material");
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
        basic_formatter<std::__cxx11::string>
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_5c0,
                   &local_628);
        LogFunctions<Assimp::FBXImporter>::LogWarn(&local_5c0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_5c0);
        std::__cxx11::string::~string((string *)&local_628);
        std::__cxx11::string::~string((string *)&local_608);
        uVar11 = 0xffffffff;
        uVar2 = 0xffffffff;
      }
LAB_004f443f:
      uvIndex = uVar2;
      if (uVar11 == 0xffffffff) {
        std::operator+(&local_608,"failed to resolve UV channel ",&local_5e8);
        std::operator+(&local_628,&local_608,", using first UV channel");
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
        basic_formatter<std::__cxx11::string>
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_5c0,
                   &local_628);
        LogFunctions<Assimp::FBXImporter>::LogWarn(&local_5c0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_5c0);
        std::__cxx11::string::~string((string *)&local_628);
        std::__cxx11::string::~string((string *)&local_608);
        uvIndex = 0;
      }
    }
    aiMaterial::AddProperty(out_mat_local,&uvIndex,1,"$tex.uvwsrc",target,0);
    std::__cxx11::string::~string((string *)&local_5e8);
  }
  return;
}

Assistant:

void FBXConverter::TrySetTextureProperties(aiMaterial* out_mat, const TextureMap& textures,
                const std::string& propName,
                aiTextureType target, const MeshGeometry* const mesh) {
            TextureMap::const_iterator it = textures.find(propName);
            if (it == textures.end()) {
                return;
            }

            const Texture* const tex = (*it).second;
            if (tex != 0)
            {
                aiString path = GetTexturePath(tex);
                out_mat->AddProperty(&path, _AI_MATKEY_TEXTURE_BASE, target, 0);

                aiUVTransform uvTrafo;
                // XXX handle all kinds of UV transformations
                uvTrafo.mScaling = tex->UVScaling();
                uvTrafo.mTranslation = tex->UVTranslation();
                out_mat->AddProperty(&uvTrafo, 1, _AI_MATKEY_UVTRANSFORM_BASE, target, 0);

                const PropertyTable& props = tex->Props();

                int uvIndex = 0;

                bool ok;
                const std::string& uvSet = PropertyGet<std::string>(props, "UVSet", ok);
                if (ok) {
                    // "default" is the name which usually appears in the FbxFileTexture template
                    if (uvSet != "default" && uvSet.length()) {
                        // this is a bit awkward - we need to find a mesh that uses this
                        // material and scan its UV channels for the given UV name because
                        // assimp references UV channels by index, not by name.

                        // XXX: the case that UV channels may appear in different orders
                        // in meshes is unhandled. A possible solution would be to sort
                        // the UV channels alphabetically, but this would have the side
                        // effect that the primary (first) UV channel would sometimes
                        // be moved, causing trouble when users read only the first
                        // UV channel and ignore UV channel assignments altogether.

                        const unsigned int matIndex = static_cast<unsigned int>(std::distance(materials.begin(),
                            std::find(materials.begin(), materials.end(), out_mat)
                        ));


                        uvIndex = -1;
                        if (!mesh)
                        {
                            for (const MeshMap::value_type& v : meshes_converted) {
                                const MeshGeometry* const meshGeom = dynamic_cast<const MeshGeometry*> (v.first);
                                if (!meshGeom) {
                                    continue;
                                }

                                const MatIndexArray& mats = meshGeom->GetMaterialIndices();
                                if (std::find(mats.begin(), mats.end(), matIndex) == mats.end()) {
                                    continue;
                                }

                                int index = -1;
                                for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
                                    if (meshGeom->GetTextureCoords(i).empty()) {
                                        break;
                                    }
                                    const std::string& name = meshGeom->GetTextureCoordChannelName(i);
                                    if (name == uvSet) {
                                        index = static_cast<int>(i);
                                        break;
                                    }
                                }
                                if (index == -1) {
                                    FBXImporter::LogWarn("did not find UV channel named " + uvSet + " in a mesh using this material");
                                    continue;
                                }

                                if (uvIndex == -1) {
                                    uvIndex = index;
                                }
                                else {
                                    FBXImporter::LogWarn("the UV channel named " + uvSet +
                                        " appears at different positions in meshes, results will be wrong");
                                }
                            }
                        }
                        else
                        {
                            int index = -1;
                            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
                                if (mesh->GetTextureCoords(i).empty()) {
                                    break;
                                }
                                const std::string& name = mesh->GetTextureCoordChannelName(i);
                                if (name == uvSet) {
                                    index = static_cast<int>(i);
                                    break;
                                }
                            }
                            if (index == -1) {
                                FBXImporter::LogWarn("did not find UV channel named " + uvSet + " in a mesh using this material");
                            }

                            if (uvIndex == -1) {
                                uvIndex = index;
                            }
                        }

                        if (uvIndex == -1) {
                            FBXImporter::LogWarn("failed to resolve UV channel " + uvSet + ", using first UV channel");
                            uvIndex = 0;
                        }
                    }
                }

                out_mat->AddProperty(&uvIndex, 1, _AI_MATKEY_UVWSRC_BASE, target, 0);
            }
        }